

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

X509_STORE * ptls_openssl_create_default_certificate_store(void)

{
  X509_STORE *v;
  X509_LOOKUP_METHOD *pXVar1;
  X509_LOOKUP *pXVar2;
  X509_LOOKUP *lookup;
  X509_STORE *store;
  
  v = X509_STORE_new();
  if (v != (X509_STORE *)0x0) {
    pXVar1 = X509_LOOKUP_file();
    pXVar2 = X509_STORE_add_lookup(v,pXVar1);
    if (pXVar2 != (X509_LOOKUP *)0x0) {
      X509_LOOKUP_ctrl(pXVar2,1,(char *)0x0,3,(char **)0x0);
      pXVar1 = X509_LOOKUP_hash_dir();
      pXVar2 = X509_STORE_add_lookup(v,pXVar1);
      if (pXVar2 != (X509_LOOKUP *)0x0) {
        X509_LOOKUP_ctrl(pXVar2,2,(char *)0x0,3,(char **)0x0);
        return (X509_STORE *)v;
      }
    }
  }
  if (v != (X509_STORE *)0x0) {
    X509_STORE_free(v);
  }
  return (X509_STORE *)0x0;
}

Assistant:

X509_STORE *ptls_openssl_create_default_certificate_store(void)
{
    X509_STORE *store;
    X509_LOOKUP *lookup;

    if ((store = X509_STORE_new()) == NULL)
        goto Error;
    if ((lookup = X509_STORE_add_lookup(store, X509_LOOKUP_file())) == NULL)
        goto Error;
    X509_LOOKUP_load_file(lookup, NULL, X509_FILETYPE_DEFAULT);
    if ((lookup = X509_STORE_add_lookup(store, X509_LOOKUP_hash_dir())) == NULL)
        goto Error;
    X509_LOOKUP_add_dir(lookup, NULL, X509_FILETYPE_DEFAULT);

    return store;
Error:
    if (store != NULL)
        X509_STORE_free(store);
    return NULL;
}